

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

float * __thiscall cimg_library::CImg<float>::max_min<float>(CImg<float> *this,float *min_val)

{
  float *pfVar1;
  float *pfVar2;
  CImgInstanceException *this_00;
  float *pfVar3;
  long lVar4;
  char *pcVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pfVar2 = this->_data;
  if ((((pfVar2 != (float *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    fVar6 = *pfVar2;
    lVar4 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    fVar7 = fVar6;
    if (0 < lVar4) {
      pfVar1 = pfVar2 + lVar4;
      pfVar3 = pfVar2;
      fVar8 = fVar6;
      do {
        fVar7 = *pfVar3;
        if (fVar6 < fVar7) {
          pfVar2 = pfVar3;
          fVar6 = fVar7;
        }
        if (fVar8 <= fVar7) {
          fVar7 = fVar8;
        }
        pfVar3 = pfVar3 + 1;
        fVar8 = fVar7;
      } while (pfVar3 < pfVar1);
    }
    *min_val = fVar7;
    return pfVar2;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar5 = "non-";
  if (this->_is_shared != false) {
    pcVar5 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar5,"float");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }